

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O3

void CheckAndSortAliases(s_assenv *ae)

{
  s_alias *psVar1;
  int iVar2;
  int iVar3;
  char *__haystack;
  int iVar4;
  char **ptr_expr;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  s_alias *psVar12;
  s_alias tmpalias;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  
  iVar9 = ae->ialias;
  uVar10 = iVar9 - 1;
  if (1 < iVar9) {
    psVar12 = ae->alias;
    ptr_expr = &psVar12[uVar10].translation;
    __haystack = *ptr_expr;
    lVar11 = 0;
    do {
      pcVar5 = strstr(__haystack,*(char **)((long)&psVar12->alias + lVar11));
      if (pcVar5 != (char *)0x0) {
        ExpressionFastTranslate(ae,ptr_expr,2);
        psVar12 = ae->alias;
        iVar9 = ae->ialias;
        sVar6 = strlen(psVar12[(long)iVar9 + -1].translation);
        psVar12[(long)iVar9 + -1].len = (int)sVar6;
        uVar10 = iVar9 - 1;
        break;
      }
      lVar11 = lVar11 + 0x18;
    } while ((ulong)uVar10 * 0x18 != lVar11);
  }
  if (uVar10 != 0) {
    psVar12 = ae->alias;
    lVar11 = (long)(int)uVar10;
    uVar7 = uVar10 * 3;
    iVar2 = psVar12[lVar11].crc;
    if (iVar2 <= psVar12[(long)iVar9 + -2].crc) {
      if (iVar2 < psVar12->crc) {
        psVar1 = psVar12 + lVar11;
        local_48._0_4_ = psVar1->crc;
        local_48._4_4_ = psVar1->len;
        local_58 = psVar1->alias;
        pcStack_50 = psVar1->translation;
        memmove(psVar12 + 1,psVar12,lVar11 * 0x18);
        psVar12 = ae->alias;
      }
      else {
        if (0 < iVar9) {
          iVar8 = 0;
          do {
            uVar7 = iVar8 + uVar10 >> 1;
            iVar3 = psVar12[uVar7].crc;
            if (iVar3 == iVar2) break;
            iVar4 = uVar7 + 1;
            if (iVar2 <= iVar3) {
              iVar4 = iVar8;
            }
            if (iVar2 < iVar3) {
              uVar10 = uVar7 - 1;
              iVar4 = iVar8;
            }
            iVar8 = iVar4;
          } while (iVar8 <= (int)uVar10);
        }
        uVar7 = uVar7 + (psVar12[(int)uVar7].crc < iVar2);
        local_48._0_4_ = psVar12[(long)iVar9 + -1].crc;
        local_48._4_4_ = psVar12[(long)iVar9 + -1].len;
        local_58 = psVar12[(long)iVar9 + -1].alias;
        pcStack_50 = psVar12[(long)iVar9 + -1].translation;
        memmove(psVar12 + (long)(int)uVar7 + 1,psVar12 + (int)uVar7,
                (long)(int)(iVar9 + ~uVar7) * 0x18);
        psVar12 = ae->alias + (int)uVar7;
      }
      psVar12->crc = (undefined4)local_48;
      psVar12->len = local_48._4_4_;
      psVar12->alias = local_58;
      psVar12->translation = pcStack_50;
    }
  }
  return;
}

Assistant:

void CheckAndSortAliases(struct s_assenv *ae)
{
	#undef FUNC
	#define FUNC "CheckAndSortAliases"

	struct s_alias tmpalias;
	int i,dw,dm,du,crc;
	for (i=0;i<ae->ialias-1;i++) {
		/* is there previous aliases in the new alias? */
		if (strstr(ae->alias[ae->ialias-1].translation,ae->alias[i].alias)) {
			/* there is a match, apply alias translation */
			ExpressionFastTranslate(ae,&ae->alias[ae->ialias-1].translation,2);
			/* need to compute again len */
			ae->alias[ae->ialias-1].len=strlen(ae->alias[ae->ialias-1].translation);
			break;
		}
	}
	
	/* cas particuliers pour insertion en d�but ou fin de liste */
	if (ae->ialias-1) {
		if (ae->alias[ae->ialias-1].crc>ae->alias[ae->ialias-2].crc) {
			/* pas de tri il est d�j� au bon endroit */
		} else if (ae->alias[ae->ialias-1].crc<ae->alias[0].crc) {
			/* insertion tout en bas de liste */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[1],&ae->alias[0],sizeof(struct s_alias)*(ae->ialias-1));
			ae->alias[0]=tmpalias;
		} else {
			/* on cherche ou inserer */
			crc=ae->alias[ae->ialias-1].crc;
			dw=0;
			du=ae->ialias-1;
			while (dw<=du) {
				dm=(dw+du)/2;
				if (ae->alias[dm].crc==crc) {
					break;
				} else if (ae->alias[dm].crc>crc) {
					du=dm-1;
				} else if (ae->alias[dm].crc<crc) {
					dw=dm+1;
				}
			}
			/* ajustement */
			if (ae->alias[dm].crc<crc) dm++;
			/* insertion */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[dm+1],&ae->alias[dm],sizeof(struct s_alias)*(ae->ialias-1-dm));
			ae->alias[dm]=tmpalias;
		}
	} else {
		/* one alias need no sort */
	}
}